

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int getfield(lua_State *L,char *key,int d,int delta)

{
  int iVar1;
  ulong uVar2;
  char *fmt;
  int isnum;
  
  iVar1 = lua_getfield(L,-1,key);
  uVar2 = lua_tointegerx(L,-1,&isnum);
  if (isnum == 0) {
    if (iVar1 == 0) {
      if (-1 < d) goto LAB_00112118;
      fmt = "field \'%s\' missing in date table";
    }
    else {
      fmt = "field \'%s\' is not an integer";
    }
LAB_0011213d:
    d = luaL_error(L,fmt,key);
  }
  else {
    if ((long)uVar2 < 0) {
      if (uVar2 < (ulong)(long)(int)(delta | 0x80000000)) goto LAB_00112136;
    }
    else if (0x7fffffff < (long)(uVar2 - (uint)delta)) {
LAB_00112136:
      fmt = "field \'%s\' is out-of-bound";
      goto LAB_0011213d;
    }
    d = (int)uVar2 - delta;
LAB_00112118:
    lua_settop(L,-2);
  }
  return d;
}

Assistant:

static int getfield (lua_State *L, const char *key, int d, int delta) {
  int isnum;
  int t = lua_getfield(L, -1, key);  /* get field and its type */
  lua_Integer res = lua_tointegerx(L, -1, &isnum);
  if (!isnum) {  /* field is not an integer? */
    if (l_unlikely(t != LUA_TNIL))  /* some other value? */
      return luaL_error(L, "field '%s' is not an integer", key);
    else if (l_unlikely(d < 0))  /* absent field; no default? */
      return luaL_error(L, "field '%s' missing in date table", key);
    res = d;
  }
  else {
    if (!(res >= 0 ? res - delta <= INT_MAX : INT_MIN + delta <= res))
      return luaL_error(L, "field '%s' is out-of-bound", key);
    res -= delta;
  }
  lua_pop(L, 1);
  return (int)res;
}